

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O3

void __thiscall
my_algorithm::WeightedDigraphSPDijkstra<int,_int>::WeightedDigraphSPDijkstra
          (WeightedDigraphSPDijkstra<int,_int> *this,WeightedDigraph<int,_int> *graph,int vertex)

{
  size_t *psVar1;
  int iVar2;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar3;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar4;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar5;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar6;
  undefined8 *puVar7;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar8;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar9;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar10;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar11;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar12;
  out_of_range *poVar13;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar14;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *_current;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  SPElement local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *local_38;
  
  this->_vptr_WeightedDigraphSPDijkstra = (_func_int **)&PTR__WeightedDigraphSPDijkstra_0010ca88;
  (this->_edge_to)._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010cab8;
  (this->_edge_to)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010cae8;
  pLVar6 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar6->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cb18;
  (pLVar6->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cb48;
  pLVar6->_next =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar6->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar6->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar6->element).value.weight = 0;
  (this->_edge_to)._list._header = pLVar6;
  (this->_edge_to)._list._tail = pLVar6;
  (this->_edge_to)._list._size = 0;
  local_58 = (SPElement)&PTR__LinkedList_0010cae8;
  puVar7 = (undefined8 *)operator_new(0x38);
  *puVar7 = &PTR__ListNode_0010cb18;
  puVar7[2] = &PTR__SymbolTableElement_0010cb48;
  puVar7[1] = 0;
  puVar7[4] = 0;
  puVar7[5] = 0;
  *(undefined4 *)(puVar7 + 6) = 0;
  local_40 = 0;
  local_50 = puVar7;
  local_48 = puVar7;
  pLVar6 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar6->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cb18;
  (pLVar6->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cb48;
  pLVar6->_next =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar6->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar6->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar6->element).value.weight = 0;
  (this->_edge_to)._list._header = pLVar6;
  (this->_edge_to)._list._tail = pLVar6;
  (this->_edge_to)._list._size = 0;
  operator_delete(puVar7,0x38);
  (this->_weight_to)._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010cb78;
  (this->_weight_to)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010cba8;
  pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  pLVar8->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cbd8;
  (pLVar8->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cc08;
  pLVar8->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  (this->_weight_to)._list._header = pLVar8;
  (this->_weight_to)._list._tail = pLVar8;
  (this->_weight_to)._list._size = 0;
  local_58 = (SPElement)&PTR__LinkedList_0010cba8;
  puVar7 = (undefined8 *)operator_new(0x20);
  *puVar7 = &PTR__ListNode_0010cbd8;
  puVar7[2] = &PTR__SymbolTableElement_0010cc08;
  puVar7[1] = 0;
  local_40 = 0;
  local_50 = puVar7;
  local_48 = puVar7;
  pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  pLVar8->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cbd8;
  (pLVar8->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cc08;
  pLVar8->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  (this->_weight_to)._list._header = pLVar8;
  (this->_weight_to)._list._tail = pLVar8;
  (this->_weight_to)._list._size = 0;
  operator_delete(puVar7,0x20);
  (this->_queue)._vptr_PriorityQueue = (_func_int **)&PTR__PriorityQueue_0010cc38;
  (this->_queue)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010cc68;
  pLVar9 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
           operator_new(0x18);
  pLVar9->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cc98;
  pLVar9->_next = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
  (this->_queue)._list._header = pLVar9;
  (this->_queue)._list._tail = pLVar9;
  (this->_queue)._list._size = 0;
  local_58 = (SPElement)&PTR__LinkedList_0010cc68;
  puVar7 = (undefined8 *)operator_new(0x18);
  *puVar7 = &PTR__ListNode_0010cc98;
  puVar7[1] = 0;
  local_40 = 0;
  local_50 = puVar7;
  local_48 = puVar7;
  pLVar9 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
           operator_new(0x18);
  pLVar9->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cc98;
  pLVar9->_next = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
  (this->_queue)._list._header = pLVar9;
  (this->_queue)._list._tail = pLVar9;
  (this->_queue)._list._size = 0;
  operator_delete(puVar7,0x18);
  this->_start = vertex;
  pLVar11 = (this->_edge_to)._list._tail;
  pLVar6 = (this->_edge_to)._list._header;
  while (pLVar6 != pLVar11) {
    pLVar3 = pLVar6->_next;
    if (pLVar3 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      pLVar6->_next = pLVar3->_next;
      (*pLVar3->_vptr_ListNode[1])(pLVar3);
      pLVar11 = (this->_edge_to)._list._tail;
    }
    if (pLVar3 == pLVar11) {
      (this->_edge_to)._list._tail = pLVar6;
      pLVar11 = pLVar6;
    }
    psVar1 = &(this->_edge_to)._list._size;
    *psVar1 = *psVar1 - 1;
    pLVar6 = (this->_edge_to)._list._header;
  }
  (this->_edge_to)._list._tail = pLVar6;
  (this->_edge_to)._list._size = 0;
  pLVar12 = (this->_weight_to)._list._tail;
  pLVar8 = (this->_weight_to)._list._header;
  while (pLVar8 != pLVar12) {
    pLVar4 = pLVar8->_next;
    if (pLVar4 != (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      pLVar8->_next = pLVar4->_next;
      (*pLVar4->_vptr_ListNode[1])(pLVar4);
      pLVar12 = (this->_weight_to)._list._tail;
    }
    if (pLVar4 == pLVar12) {
      (this->_weight_to)._list._tail = pLVar8;
      pLVar12 = pLVar8;
    }
    psVar1 = &(this->_weight_to)._list._size;
    *psVar1 = *psVar1 - 1;
    pLVar8 = (this->_weight_to)._list._header;
  }
  (this->_weight_to)._list._tail = pLVar8;
  (this->_weight_to)._list._size = 0;
  pLVar10 = (this->_queue)._list._tail;
  pLVar9 = (this->_queue)._list._header;
  while (pLVar9 != pLVar10) {
    pLVar5 = pLVar9->_next;
    if (pLVar5 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
      pLVar9->_next = pLVar5->_next;
      (*pLVar5->_vptr_ListNode[1])(pLVar5);
      pLVar10 = (this->_queue)._list._tail;
    }
    if (pLVar5 == pLVar10) {
      (this->_queue)._list._tail = pLVar9;
      pLVar10 = pLVar9;
    }
    psVar1 = &(this->_queue)._list._size;
    *psVar1 = *psVar1 - 1;
    pLVar9 = (this->_queue)._list._header;
  }
  local_38 = &this->_queue;
  (this->_queue)._list._tail = pLVar9;
  (this->_queue)._list._size = 0;
  pRVar14 = (graph->super_WeightedGraph<int,_int>)._tree._root;
  while( true ) {
    if (pRVar14 ==
        (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
         *)0x0) {
      poVar13 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar13,"Key error, no such key in this tree !");
      __cxa_throw(poVar13,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    iVar2 = (pRVar14->element).key;
    if (iVar2 == vertex) break;
    pRVar14 = (&pRVar14->_left)[iVar2 <= vertex];
  }
  pLVar6 = (this->_edge_to)._list._header;
  do {
    pLVar6 = pLVar6->_next;
    if (pLVar6 == (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      pLVar6 = (this->_edge_to)._list._tail;
      pLVar11 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                 *)operator_new(0x38);
      pLVar11->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cb18;
      (pLVar11->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cb48;
      (pLVar11->element).key = vertex;
      (pLVar11->element).value.from = pRVar14;
      (pLVar11->element).value.to = pRVar14;
      (pLVar11->element).value.weight = 0;
      pLVar11->_next = pLVar6->_next;
      pLVar6->_next = pLVar11;
      psVar1 = &(this->_edge_to)._list._size;
      *psVar1 = *psVar1 + 1;
      (this->_edge_to)._list._tail = pLVar11;
      goto LAB_00103808;
    }
  } while ((pLVar6->element).key != vertex);
  (pLVar6->element).value.from = pRVar14;
  (pLVar6->element).value.to = pRVar14;
  (pLVar6->element).value.weight = 0;
LAB_00103808:
  pLVar8 = (this->_weight_to)._list._header;
  do {
    pLVar8 = pLVar8->_next;
    if (pLVar8 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      pLVar8 = (this->_weight_to)._list._tail;
      pLVar12 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
      pLVar12->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cbd8;
      (pLVar12->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cc08;
      (pLVar12->element).key = vertex;
      (pLVar12->element).value = 0;
      pLVar12->_next = pLVar8->_next;
      pLVar8->_next = pLVar12;
      psVar1 = &(this->_weight_to)._list._size;
      *psVar1 = *psVar1 + 1;
      (this->_weight_to)._list._tail = pLVar12;
      goto LAB_00103866;
    }
  } while ((pLVar8->element).key != vertex);
  (pLVar8->element).value = 0;
LAB_00103866:
  local_58.weight = 0;
  local_58.vertex = this->_start;
  data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
  enqueue(local_38,&local_58);
  pLVar9 = (this->_queue)._list._header;
  if (pLVar9 != (this->_queue)._list._tail) {
    do {
      if ((this->_queue)._list._size == 0) {
        poVar13 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range
                  (poVar13,"N must be larger than 0 and less than this queue\'s size !");
        __cxa_throw(poVar13,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      pLVar10 = pLVar9->_next;
      local_58 = pLVar10->element;
      pLVar9->_next = pLVar10->_next;
      (*pLVar10->_vptr_ListNode[1])(pLVar10);
      if (pLVar10 == (this->_queue)._list._tail) {
        (this->_queue)._list._tail = pLVar9;
      }
      psVar1 = &(this->_queue)._list._size;
      *psVar1 = *psVar1 - 1;
      _relax(this,graph,&local_58);
      pLVar9 = (this->_queue)._list._header;
    } while (pLVar9 != (this->_queue)._list._tail);
  }
  return;
}

Assistant:

WeightedDigraphSPDijkstra(WeightedDigraph<T, Weight> &graph, T vertex) {
            _start = vertex;
            _edge_to.clear();
            _weight_to.clear();
            _queue.clear();
            auto start = graph.getNode(vertex);
            _edge_to.set(vertex, Edge(start, start, Weight()));
            _weight_to.set(vertex, Weight());
            _queue.enqueue(SPElement(_start, Weight()));
            while (!_queue.isEmpty()) {
                _relax(graph, _queue.dequeueMinN(1));
            }
        }